

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O2

string * cmake::FindCacheFile(string *__return_storage_ptr__,string *binaryDir)

{
  bool bVar1;
  string cachePathFound;
  string cmakeFiles;
  string cacheFile;
  allocator<char> local_d2;
  allocator<char> local_d1;
  cmAlphaNum local_d0;
  cmAlphaNum local_a0;
  string local_70;
  string local_50;
  string local_30;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)binaryDir);
  cmsys::SystemTools::ConvertToUnixSlashes(__return_storage_ptr__);
  local_a0.View_._M_str = (__return_storage_ptr__->_M_dataplus)._M_p;
  local_a0.View_._M_len = __return_storage_ptr__->_M_string_length;
  local_d0.View_._M_len = 0xf;
  local_d0.View_._M_str = "/CMakeCache.txt";
  cmStrCat<>(&local_30,&local_a0,&local_d0);
  bVar1 = cmsys::SystemTools::FileExists(&local_30);
  if (!bVar1) {
    local_a0.View_._M_str = (__return_storage_ptr__->_M_dataplus)._M_p;
    local_a0.View_._M_len = __return_storage_ptr__->_M_string_length;
    local_d0.View_._M_len = (size_t)&DAT_0000000b;
    local_d0.View_._M_str = "/CMakeFiles";
    cmStrCat<>(&local_50,&local_a0,&local_d0);
    bVar1 = cmsys::SystemTools::FileExists(&local_50);
    if (bVar1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_d0,"CMakeCache.txt",&local_d1);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"/",&local_d2);
      cmSystemTools::FileExistsInParentDirectories
                ((string *)&local_a0,(string *)&local_d0,__return_storage_ptr__,&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_d0);
      if (local_a0.View_._M_str != (pointer)0x0) {
        cmsys::SystemTools::GetFilenamePath((string *)&local_d0,(string *)&local_a0);
        std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_d0);
        std::__cxx11::string::~string((string *)&local_d0);
      }
      std::__cxx11::string::~string((string *)&local_a0);
    }
    std::__cxx11::string::~string((string *)&local_50);
  }
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

std::string cmake::FindCacheFile(const std::string& binaryDir)
{
  std::string cachePath = binaryDir;
  cmSystemTools::ConvertToUnixSlashes(cachePath);
  std::string cacheFile = cmStrCat(cachePath, "/CMakeCache.txt");
  if (!cmSystemTools::FileExists(cacheFile)) {
    // search in parent directories for cache
    std::string cmakeFiles = cmStrCat(cachePath, "/CMakeFiles");
    if (cmSystemTools::FileExists(cmakeFiles)) {
      std::string cachePathFound =
        cmSystemTools::FileExistsInParentDirectories("CMakeCache.txt",
                                                     cachePath, "/");
      if (!cachePathFound.empty()) {
        cachePath = cmSystemTools::GetFilenamePath(cachePathFound);
      }
    }
  }
  return cachePath;
}